

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxylogger.cpp
# Opt level: O0

void __thiscall MyClass::Test(MyClass *this)

{
  char *in_RDI;
  
  liblogger::ProxyLogger::LogDebug(in_RDI,"Debug Logging #1");
  liblogger::ProxyLogger::LogDebug(in_RDI,"Debug Logging #%d",2);
  liblogger::ProxyLogger::LogInfo(in_RDI,"Info Logging #1");
  liblogger::ProxyLogger::LogInfo(in_RDI,"Info Logging #%d",2);
  liblogger::ProxyLogger::LogNotice(in_RDI,"Notice Logging #1");
  liblogger::ProxyLogger::LogNotice(in_RDI,"%s Logging #2","Notice");
  liblogger::ProxyLogger::LogWarning(in_RDI,"Warning!!!!!!");
  liblogger::ProxyLogger::LogWarning(in_RDI,"Warning!!!!!! #%d",2);
  liblogger::ProxyLogger::LogError(in_RDI,"This is an Error");
  liblogger::ProxyLogger::LogError(in_RDI,"This is an Error %d",2);
  liblogger::ProxyLogger::LogError(in_RDI,"Something Critical happened");
  liblogger::ProxyLogger::LogError(in_RDI,"Something Critical happened %s","Really BAD!");
  liblogger::ProxyLogger::LogAlert(in_RDI,"Alert Alert");
  liblogger::ProxyLogger::LogAlert(in_RDI,"Alert Alert %s","Alert");
  liblogger::ProxyLogger::LogCritical(in_RDI,"TestLog Critical!");
  liblogger::ProxyLogger::LogEmergency(in_RDI,"TestLog Emergency!");
  return;
}

Assistant:

void Test() {
            LogDebug("Debug Logging #1");
            LogDebug("Debug Logging #%d", 2);

            LogInfo("Info Logging #1");
            LogInfo("Info Logging #%d", 2);

            LogNotice("Notice Logging #1");
            LogNotice("%s Logging #2", "Notice");

            LogWarning("Warning!!!!!!");
            LogWarning("Warning!!!!!! #%d", 2);

            LogError("This is an Error");
            LogError("This is an Error %d", 2);

            LogError("Something Critical happened");
            LogError("Something Critical happened %s", "Really BAD!");

            LogAlert("Alert Alert");
            LogAlert("Alert Alert %s", "Alert");

            LogCritical("TestLog Critical!");

            LogEmergency("TestLog Emergency!");
        }